

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3Vacuum(Parse *pParse,Token *pNm,Expr *pInto)

{
  int p1;
  int iVar1;
  uint uVar2;
  Vdbe *p;
  int target;
  SrcList sSrc;
  Token *local_f0;
  NameContext local_e8;
  SrcList local_a8;
  
  local_f0 = pNm;
  p = sqlite3GetVdbe(pParse);
  if (p != (Vdbe *)0x0) {
    target = 0;
    p1 = 0;
    if (pNm != (Token *)0x0) {
      p1 = sqlite3TwoPartName(pParse,pNm,pNm,&local_f0);
      if (p1 == 1 || p1 < 0) goto LAB_0016509a;
    }
    if (pInto != (Expr *)0x0) {
      local_e8.nRef = 0;
      local_e8.nErr = 0;
      target = 0;
      local_e8.pWinSelect = (Select *)0x0;
      local_e8.uNC.pEList = (ExprList *)0x0;
      local_e8.pNext = (NameContext *)0x0;
      local_e8.pSrcList = &local_a8;
      local_a8.nSrc = 0;
      local_a8.nAlloc = 0;
      local_a8.a[0].pSchema = (Schema *)0x0;
      local_a8.a[0].zDatabase = (char *)0x0;
      local_a8.a[0].zName = (char *)0x0;
      local_a8.a[0].zAlias = (char *)0x0;
      local_a8.a[0].pTab = (Table *)0x0;
      local_a8.a[0].pSelect = (Select *)0x0;
      local_a8.a[0].addrFillSub = 0;
      local_a8.a[0].regReturn = 0;
      local_a8.a[0].regResult = 0;
      local_a8.a[0].fg = (anon_struct_4_7_7ffbf296_for_fg)0x0;
      local_a8.a[0].iCursor = 0;
      local_a8.a[0]._68_4_ = 0;
      local_a8.a[0].pOn = (Expr *)0x0;
      local_a8.a[0].pUsing = (IdList *)0x0;
      local_a8.a[0].colUsed = 0;
      local_a8.a[0].u1.zIndexedBy = (char *)0x0;
      local_a8.a[0].pIBIndex = (Index *)0x0;
      local_e8.ncFlags = 0;
      local_e8._42_6_ = 0;
      local_e8.pParse = pParse;
      iVar1 = sqlite3ResolveExprNames(&local_e8,pInto);
      if (iVar1 == 0) {
        target = pParse->nMem + 1;
        pParse->nMem = target;
        sqlite3ExprCode(pParse,pInto,target);
      }
    }
    sqlite3VdbeAddOp3(p,8,p1,target,0);
    uVar2 = 1 << ((byte)p1 & 0x1f);
    p->btreeMask = p->btreeMask | uVar2;
    if ((p1 != 1) && ((p->db->aDb[p1].pBt)->sharable != '\0')) {
      p->lockMask = p->lockMask | uVar2;
    }
  }
LAB_0016509a:
  if (pInto != (Expr *)0x0) {
    sqlite3ExprDeleteNN(pParse->db,pInto);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3Vacuum(Parse *pParse, Token *pNm, Expr *pInto){
  Vdbe *v = sqlite3GetVdbe(pParse);
  int iDb = 0;
  if( v==0 ) goto build_vacuum_end;
  if( pNm ){
#ifndef SQLITE_BUG_COMPATIBLE_20160819
    /* Default behavior:  Report an error if the argument to VACUUM is
    ** not recognized */
    iDb = sqlite3TwoPartName(pParse, pNm, pNm, &pNm);
    if( iDb<0 ) goto build_vacuum_end;
#else
    /* When SQLITE_BUG_COMPATIBLE_20160819 is defined, unrecognized arguments
    ** to VACUUM are silently ignored.  This is a back-out of a bug fix that
    ** occurred on 2016-08-19 (https://www.sqlite.org/src/info/083f9e6270).
    ** The buggy behavior is required for binary compatibility with some
    ** legacy applications. */
    iDb = sqlite3FindDb(pParse->db, pNm);
    if( iDb<0 ) iDb = 0;
#endif
  }
  if( iDb!=1 ){
    int iIntoReg = 0;
    if( pInto && sqlite3ResolveSelfReference(pParse,0,0,pInto,0)==0 ){
      iIntoReg = ++pParse->nMem;
      sqlite3ExprCode(pParse, pInto, iIntoReg);
    }
    sqlite3VdbeAddOp2(v, OP_Vacuum, iDb, iIntoReg);
    sqlite3VdbeUsesBtree(v, iDb);
  }
build_vacuum_end:
  sqlite3ExprDelete(pParse->db, pInto);
  return;
}